

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::DBTest::DBTest(DBTest *this)

{
  SpecialEnv *this_00;
  Env *base;
  FilterPolicy *pFVar1;
  Options local_c8;
  Status local_68;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [48];
  DBTest *local_10;
  DBTest *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  this_00 = (SpecialEnv *)operator_new(0x48);
  base = Env::Default();
  SpecialEnv::SpecialEnv(this_00,base);
  this->env_ = this_00;
  Options::Options(&this->last_options_);
  this->option_config_ = 0;
  pFVar1 = NewBloomFilterPolicy(10);
  this->filter_policy_ = pFVar1;
  test::TmpDir_abi_cxx11_();
  std::operator+(local_40,(char *)local_60);
  std::__cxx11::string::operator=((string *)this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string(local_60);
  Options::Options(&local_c8);
  DestroyDB((leveldb *)&local_68,&this->dbname_,&local_c8);
  Status::~Status(&local_68);
  this->db_ = (DB *)0x0;
  Reopen(this,(Options *)0x0);
  return;
}

Assistant:

DBTest() : env_(new SpecialEnv(Env::Default())), option_config_(kDefault) {
    filter_policy_ = NewBloomFilterPolicy(10);
    dbname_ = test::TmpDir() + "/db_test";
    DestroyDB(dbname_, Options());
    db_ = nullptr;
    Reopen();
  }